

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

bool __thiscall QString::startsWith(QString *this,QString *s,CaseSensitivity cs)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  char16_t *pcVar4;
  int iVar5;
  QStringView rhs;
  QStringView lhs;
  
  pcVar1 = (this->d).ptr;
  pcVar2 = (s->d).ptr;
  pcVar4 = pcVar2;
  if (pcVar1 != (char16_t *)0x0) {
    pcVar3 = (char16_t *)(this->d).size;
    pcVar4 = (char16_t *)(s->d).size;
    if (pcVar3 != (char16_t *)0x0) {
      if (pcVar4 <= pcVar3) {
        rhs.m_data = pcVar2;
        rhs.m_size = (qsizetype)pcVar4;
        lhs.m_data = pcVar1;
        lhs.m_size = (qsizetype)pcVar4;
        iVar5 = QtPrivate::compareStrings(lhs,rhs,cs);
        return iVar5 == 0;
      }
      return false;
    }
  }
  return pcVar4 == (char16_t *)0x0;
}

Assistant:

bool QString::startsWith(const QString& s, Qt::CaseSensitivity cs) const
{
    return qt_starts_with_impl(QStringView(*this), QStringView(s), cs);
}